

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod.c
# Opt level: O0

void terminate(int signum)

{
  gpioTerminate();
  fprintf((FILE *)errFifo,"SIGHUP/SIGTERM received\n");
  fflush((FILE *)0x0);
  fclose((FILE *)errFifo);
  unlink("/dev/pigerr");
  exit(0);
}

Assistant:

void terminate(int signum)
{
   /* only registered for SIGHUP/SIGTERM */

   gpioTerminate();

   fprintf(errFifo, "SIGHUP/SIGTERM received\n");

   fflush(NULL);

   fclose(errFifo);

   unlink(PI_ERRFIFO);

   exit(0);
}